

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# POMDPDiscrete.cpp
# Opt level: O0

void __thiscall
POMDPDiscrete::POMDPDiscrete(POMDPDiscrete *this,string *name,string *descr,string *pf)

{
  string *in_RCX;
  void **in_RDX;
  DecPOMDPDiscrete *in_RSI;
  undefined8 *in_RDI;
  DecPOMDPDiscreteInterface *this_00;
  size_t in_stack_00000098;
  MultiAgentDecisionProcess *in_stack_000000a0;
  string *in_stack_ffffffffffffffd0;
  string *in_stack_ffffffffffffffd8;
  
  this_00 = (DecPOMDPDiscreteInterface *)(in_RDI + 0x44);
  MultiAgentDecisionProcessInterface::MultiAgentDecisionProcessInterface
            ((MultiAgentDecisionProcessInterface *)this_00);
  POSGInterface::POSGInterface((POSGInterface *)this_00,&PTR_PTR_00d424b0);
  DecPOMDPInterface::DecPOMDPInterface((DecPOMDPInterface *)this_00,&PTR_PTR_00d42498);
  MultiAgentDecisionProcessDiscreteInterface::MultiAgentDecisionProcessDiscreteInterface
            ((MultiAgentDecisionProcessDiscreteInterface *)(in_RDI + 0x45),
             &PTR_construction_vtable_384__00d424c0);
  DecPOMDPDiscreteInterface::DecPOMDPDiscreteInterface
            (this_00,&PTR_construction_vtable_232__00d42470);
  DecPOMDPDiscrete::DecPOMDPDiscrete
            (in_RSI,in_RDX,in_RCX,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  *in_RDI = 0xd41be8;
  in_RDI[0x44] = 0xd41fe8;
  in_RDI[0x44] = 0xd41fe8;
  in_RDI[0x44] = 0xd41fe8;
  in_RDI[0x44] = 0xd41fe8;
  in_RDI[0x45] = 0xd42240;
  in_RDI[0x40] = 0xd41e60;
  MultiAgentDecisionProcess::SetNrAgents(in_stack_000000a0,in_stack_00000098);
  return;
}

Assistant:

POMDPDiscrete::POMDPDiscrete(const std::string &name,
                             const std::string &descr,
                             const std::string &pf) :
    DecPOMDPDiscrete(name,descr,pf)
{
    this->SetNrAgents(1);
}